

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefidump.cpp
# Opt level: O3

USTATUS __thiscall
UEFIDumper::dump(UEFIDumper *this,UByteArray *buffer,CBString *inPath,CBString *guid)

{
  char *__s;
  char cVar1;
  bool bVar2;
  byte bVar3;
  USTATUS UVar4;
  size_t sVar5;
  USTATUS UVar6;
  long lVar7;
  ulong uVar8;
  vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> report;
  CBString reportPath;
  CBString path;
  FfsReport ffsReport;
  ofstream ofs;
  undefined1 auStack_288 [8];
  undefined1 local_280 [8];
  pointer local_278;
  pointer pCStack_270;
  CBString local_268;
  CBString local_250;
  FfsReport local_238;
  undefined1 local_230 [248];
  ios_base local_138 [264];
  
  Bstrlib::CBString::CBString((CBString *)local_230,inPath);
  Bstrlib::CBString::CBString(&local_268,".dump");
  Bstrlib::CBString::operator+(&local_250,(CBString *)local_230,&local_268);
  Bstrlib::CBString::~CBString(&local_268);
  Bstrlib::CBString::~CBString((CBString *)local_230);
  Bstrlib::CBString::CBString((CBString *)local_230,inPath);
  Bstrlib::CBString::CBString((CBString *)local_280,".report.txt");
  Bstrlib::CBString::operator+(&local_268,(CBString *)local_230,(CBString *)local_280);
  Bstrlib::CBString::~CBString((CBString *)local_280);
  Bstrlib::CBString::~CBString((CBString *)local_230);
  bVar3 = this->initialized;
  if ((bool)bVar3 == true) {
    bVar2 = UByteArray::operator!=(buffer,&this->currentBuffer);
    if (!bVar2) {
      bVar3 = this->initialized;
      goto LAB_0010e11a;
    }
    this->initialized = false;
LAB_0010e122:
    std::__cxx11::string::_M_assign((string *)&this->currentBuffer);
    UVar4 = FfsParser::parse(&this->ffsParser,buffer);
    if (UVar4 != 0) goto LAB_0010e325;
    FfsParser::outputInfo(&this->ffsParser);
    local_238.model = &this->model;
    FfsReport::generate((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)local_280,
                        &local_238);
    if ((undefined1  [8])local_278 != local_280) {
      std::ofstream::ofstream(local_230);
      std::ofstream::open((char *)local_230,(_Ios_Openmode)local_268.super_tagbstring.data);
      if ((undefined1  [8])local_278 != local_280) {
        lVar7 = 0x10;
        uVar8 = 0;
        do {
          __s = *(char **)((long)(_func_int ***)local_280 + lVar7);
          if (__s == (char *)0x0) {
            std::ios::clear((int)(auStack_288 +
                                 (((TreeItem *)(local_230._0_8_ + -0x118))->itemUncompressedData).d.
                                 field_2._M_allocated_capacity) + 0x58);
          }
          else {
            sVar5 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,__s,sVar5);
          }
          cVar1 = (char)(ostream *)local_230;
          std::ios::widen((char)(((TreeItem *)(local_230._0_8_ + -0x118))->itemUncompressedData).d.
                                field_2._M_allocated_capacity + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x18;
        } while (uVar8 < (ulong)(((long)local_278 - (long)local_280 >> 3) * -0x5555555555555555));
      }
      std::ofstream::close();
      local_230._0_8_ = _VTT;
      *(undefined8 *)(local_230 + _VTT[-1].itemUncompressedData.d.field_2._M_allocated_capacity) =
           _memcpy;
      std::filebuf::~filebuf((filebuf *)(local_230 + 8));
      std::ios_base::~ios_base(local_138);
    }
    this->initialized = true;
    std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::~vector
              ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)local_280);
  }
  else {
LAB_0010e11a:
    if ((bVar3 & 1) == 0) goto LAB_0010e122;
  }
  bVar2 = isExistOnFs(&local_250);
  UVar4 = 0x22;
  if (!bVar2) {
    bVar2 = makeDirectory(&local_250);
    UVar4 = 0x23;
    if (bVar2) {
      bVar2 = changeDirectory(&local_250);
      UVar4 = 0x24;
      if (bVar2) {
        this->dumped = false;
        local_280 = (undefined1  [8])0xffffffffffffffff;
        local_278 = (pointer)0x0;
        pCStack_270 = (pointer)0x0;
        TreeModel::index((TreeModel *)local_230,(char *)this,0);
        UVar6 = recursiveDump(this,(UModelIndex *)local_230);
        UVar4 = 1;
        if (UVar6 == 0) {
          UVar4 = (ulong)(((byte)~this->dumped & 1) << 3);
        }
      }
    }
  }
LAB_0010e325:
  Bstrlib::CBString::~CBString(&local_268);
  Bstrlib::CBString::~CBString(&local_250);
  return UVar4;
}

Assistant:

USTATUS UEFIDumper::dump(const UByteArray & buffer, const UString & inPath, const UString & guid)
{
    UString path = UString(inPath) + UString(".dump");
    UString reportPath = UString(inPath) + UString(".report.txt");

    if (initialized) {
        // Check if called with a different buffer as before
        if (buffer != currentBuffer) {
            // Reinitalize if so
            initialized = false;
        }
    }

    if (!initialized) {
        // Fill currentBuffer
        currentBuffer = buffer;

        // Parse FFS structure
        USTATUS result = ffsParser.parse(buffer);
        if (result)
            return result;

        ffsParser.outputInfo();

        // Create ffsReport
        FfsReport ffsReport(&model);
        std::vector<UString> report = ffsReport.generate();
        if (report.size()) {
            std::ofstream ofs;
            ofs.open(reportPath, std::ofstream::out);
            for (size_t i = 0; i < report.size(); i++) {
                ofs << report[i].toLocal8Bit() << std::endl;
            }
            ofs.close();
        }
        
        initialized = true;
    }
    
    // Check for dump directory existence
    if (isExistOnFs(path))
        return U_DIR_ALREADY_EXIST;

    // Create dump directory and cd to it
    if (!makeDirectory(path))
        return U_DIR_CREATE;

    if (!changeDirectory(path))
        return U_DIR_CHANGE;
    
    dumped = false;
    USTATUS result = recursiveDump(model.index(0,0));
    if (result)
        return result;
    else if (!dumped)
        return U_ITEM_NOT_FOUND;

    return U_SUCCESS;
}